

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

void __thiscall
icu_63::CollationDataBuilder::setDigitTags(CollationDataBuilder *this,UErrorCode *errorCode)

{
  undefined4 c;
  UBool UVar1;
  uint32_t ce32;
  int32_t iVar2;
  int32_t iVar3;
  UnicodeSetIterator iter;
  UnicodeSet digits;
  ConstChar16Ptr local_d8;
  char16_t *local_d0;
  undefined1 local_c0 [64];
  UnicodeSet local_80;
  
  local_d8.p_ = L"[:Nd:]";
  UnicodeString::UnicodeString((UnicodeString *)local_c0,'\x01',&local_d8,-1);
  UnicodeSet::UnicodeSet(&local_80,(UnicodeString *)local_c0,errorCode);
  UnicodeString::~UnicodeString((UnicodeString *)local_c0);
  local_d0 = local_d8.p_;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)local_c0,&local_80);
    while( true ) {
      UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)local_c0);
      c = local_c0._8_4_;
      if (UVar1 == '\0') break;
      ce32 = utrie2_get32_63(this->trie,local_c0._8_4_);
      if ((ce32 != 0xffffffff) && (ce32 != 0xc0)) {
        iVar2 = addCE32(this,ce32,errorCode);
        if (U_ZERO_ERROR < *errorCode) break;
        if (0x7ffff < iVar2) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          break;
        }
        iVar3 = u_charDigitValue_63(c);
        utrie2_set32_63(this->trie,c,iVar3 << 8 | iVar2 << 0xd | 0xca,errorCode);
      }
    }
    UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)local_c0);
  }
  UnicodeSet::~UnicodeSet(&local_80);
  return;
}

Assistant:

void
CollationDataBuilder::setDigitTags(UErrorCode &errorCode) {
    UnicodeSet digits(UNICODE_STRING_SIMPLE("[:Nd:]"), errorCode);
    if(U_FAILURE(errorCode)) { return; }
    UnicodeSetIterator iter(digits);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        UChar32 c = iter.getCodepoint();
        uint32_t ce32 = utrie2_get32(trie, c);
        if(ce32 != Collation::FALLBACK_CE32 && ce32 != Collation::UNASSIGNED_CE32) {
            int32_t index = addCE32(ce32, errorCode);
            if(U_FAILURE(errorCode)) { return; }
            if(index > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return;
            }
            ce32 = Collation::makeCE32FromTagIndexAndLength(
                    Collation::DIGIT_TAG, index, u_charDigitValue(c));
            utrie2_set32(trie, c, ce32, &errorCode);
        }
    }
}